

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

bool __thiscall GameEngine::validate(GameEngine *this)

{
  pointer psVar1;
  Map *this_00;
  int32_t iVar2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar3;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar4;
  bool bVar5;
  pointer __x;
  pointer __x_00;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> newPopulations;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> newPlayers;
  shared_ptr<Population> local_88;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> local_78;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> local_58;
  pointer local_38;
  
  local_58.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x_00 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->players).
             super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != local_38) {
    do {
      local_78.
      super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar3 = Player::GetPlayerPopulations
                         ((__x_00->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      psVar1 = (pvVar3->
               super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (pvVar3->
                 super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __x != psVar1; __x = __x + 1) {
        iVar2 = Population::GetAnimalAmount
                          ((__x->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        if (iVar2 < 1) {
          this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar2 = Population::GetYPos((__x->
                                      super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr);
          pvVar4 = Map::operator[](this_00,(long)iVar2);
          iVar2 = Population::GetXPos((__x->
                                      super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr);
          local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          CellType::setCurrentPopulation
                    ((pvVar4->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[iVar2].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88);
          if (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
          push_back(&local_78,__x);
        }
      }
      Player::SetPlayerPopulations
                ((__x_00->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&local_78);
      if (local_78.
          super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_78.
          super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::push_back
                  (&local_58,__x_00);
      }
      std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
      ~vector(&local_78);
      __x_00 = __x_00 + 1;
    } while (__x_00 != local_38);
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::operator=
            (&this->players,&local_58);
  if (((ulong)((long)(this->players).
                     super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->players).
                    super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x11) ||
     (bVar5 = true, this->maxStep < this->currentStep)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End game!",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    bVar5 = false;
  }
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::~vector
            (&local_58);
  return bVar5;
}

Assistant:

bool GameEngine::validate() {
  std::vector<std::shared_ptr<Player> > newPlayers;
  for (const auto &player : players) {
    std::vector<std::shared_ptr<Population> > newPopulations;
    for (const auto &population : player->GetPlayerPopulations()) {
      if (population->GetAnimalAmount() > 0) {
        newPopulations.push_back(population);
      } else {
        (*map)[population->GetYPos()][population->GetXPos()]->setCurrentPopulation(nullptr);
      }
    }
    player->SetPlayerPopulations(newPopulations);

    if (!newPopulations.empty()) {
      newPlayers.push_back(player);
    }
  }
  players = newPlayers;

  if ((players.size() < 2) || (currentStep > maxStep)) {
    std::cout << "End game!" << std::endl;
    return false;
  }
  return true;
}